

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O0

VisitError<typename_Visitor::ResultType> * __thiscall
Fixpp::
visit<should_visit_repeating_group_in_logon_frame::Visitor,DefaultTestRules<Fixpp::v42::Spec::Dictionary>>
          (VisitError<void> *__return_storage_ptr__,Fixpp *this,size_t frame,undefined8 size)

{
  undefined1 local_f8 [8];
  TypedParsingContext<void> context;
  StreamCursor local_78;
  StreamCursor cursor;
  RawStreamBuf<char> streambuf;
  Visitor *visitor_local;
  size_t size_local;
  char *frame_local;
  
  checkRules<DefaultTestRules<Fixpp::v42::Spec::Dictionary>>();
  RawStreamBuf<char>::RawStreamBuf((RawStreamBuf<char> *)&cursor,(char *)this,frame);
  StreamCursor::StreamCursor(&local_78,(StreamBuf<char> *)&cursor,0);
  TypedParsingContext<void>::TypedParsingContext((TypedParsingContext<void> *)local_f8,&local_78);
  visitMessage<should_visit_repeating_group_in_logon_frame::Visitor,DefaultTestRules<Fixpp::v42::Spec::Dictionary>,Fixpp::TypedParsingContext<void>>
            (local_f8,size);
  TypedParsingContext<void>::toVisitError
            (__return_storage_ptr__,(TypedParsingContext<void> *)local_f8);
  RawStreamBuf<char>::~RawStreamBuf((RawStreamBuf<char> *)&cursor);
  return __return_storage_ptr__;
}

Assistant:

auto visit(const char* frame, size_t size, Visitor& visitor, Rules rules) -> VisitError<typename Visitor::ResultType>
    {
        static_assert(
            meta::is_detected<impl::rules::HasResultType, Visitor>::value,
            "Visitor must fulfill StaticVisitor requirement and must expose an inner ResultType type"
        );
        checkRules<Rules>();

        RawStreamBuf<> streambuf(const_cast<char *>(frame), size);
        StreamCursor cursor(&streambuf);

        using ResultType = typename Visitor::ResultType;

        TypedParsingContext<ResultType> context(cursor);
        visitMessage(context, visitor, rules);

        return context.toVisitError();
    }